

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GotoLabel *goto_label)

{
  pointer pTVar1;
  Type TVar2;
  bool bVar3;
  Label *label;
  ulong uVar4;
  pointer args;
  LabelName *u;
  LabelName *u_00;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 local_68;
  Index IStack_60;
  GotoLabel *local_58;
  undefined8 local_50;
  Index IStack_48;
  long local_40 [2];
  
  local_58 = goto_label;
  label = FindLabel(this,goto_label->var,true);
  pTVar1 = (label->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  args = (label->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  if (pTVar1 != args) {
    uVar6 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    uVar4 = label->type_stack_size;
    if (uVar6 < uVar4) {
      __assert_fail("type_stack_.size() >= label->type_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x497,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    uVar7 = (long)args - (long)pTVar1 >> 3;
    if (uVar6 < uVar7) {
      __assert_fail("type_stack_.size() >= amount",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x498,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    if (uVar6 - uVar7 < uVar4) {
      __assert_fail("type_stack_.size() - amount >= label->type_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x499,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    iVar5 = (int)uVar6 - ((int)uVar4 + (int)uVar7);
    if ((iVar5 != 0) && (args != pTVar1)) {
      uVar4 = 0;
      uVar6 = 1;
      do {
        local_68._0_4_ = ~(uint)uVar4 + (int)uVar7;
        args = (pointer)(ulong)(uint)local_68;
        local_50._0_4_ = (uint)local_68 + iVar5;
        TVar2 = (label->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        local_50._4_4_ = TVar2.enum_;
        IStack_48 = TVar2.type_index_;
        local_68._4_4_ = Any;
        IStack_60 = 0;
        Write(this,(StackVar *)&local_50);
        WriteData(this," = ",3);
        Write(this,(StackVar *)&local_68);
        WriteData(this,"; ",2);
        bVar3 = uVar6 < uVar7;
        uVar4 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar3);
    }
  }
  WriteUnwindTryCatchStack(this,label);
  if (local_58->var->type_ == Name) {
    local_50 = &local_58->var->field_2;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [6])&local_50,u,(char (*) [2])args);
  }
  else {
    local_50 = (anon_union_32_2_9f84448a_for_Var_2 *)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,&(anonymous_namespace)::kImplicitFuncLabel,0x171016);
    local_68 = (string *)&local_50;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [6])&local_68,u_00,(char (*) [2])args);
    if (local_50 != (anon_union_32_2_9f84448a_for_Var_2 *)local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return;
}

Assistant:

void CWriter::Write(const GotoLabel& goto_label) {
  const Label* label = FindLabel(goto_label.var);
  if (label->HasValue()) {
    size_t amount = label->sig.size();
    assert(type_stack_.size() >= label->type_stack_size);
    assert(type_stack_.size() >= amount);
    assert(type_stack_.size() - amount >= label->type_stack_size);
    Index offset = type_stack_.size() - label->type_stack_size - amount;
    if (offset != 0) {
      for (Index i = 0; i < amount; ++i) {
        Write(StackVar(amount - i - 1 + offset, label->sig[i]), " = ",
              StackVar(amount - i - 1), "; ");
      }
    }
  }

  WriteUnwindTryCatchStack(label);

  if (goto_label.var.is_name()) {
    Write("goto ", LabelName(goto_label.var.name()), ";");
  } else {
    // We've generated names for all labels, so we should only be using an
    // index when branching to the implicit function label, which can't be
    // named.
    Write("goto ", LabelName(kImplicitFuncLabel), ";");
  }
}